

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

int __thiscall CVmConsole::read_line_from_script(CVmConsole *this,char *buf,size_t buflen,int *evt)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  int unaff_EBP;
  CVmConsole *this_00;
  FILE *this_01;
  
  if (this->script_sp_ == (script_stack_entry *)0x0) {
    unaff_EBP = 0;
  }
  else {
    __stream = (FILE *)this->script_sp_->fp;
    do {
      while (this->script_sp_->event_script != 0) {
        this_00 = this;
        iVar2 = read_script_event_type(this,evt,(unsigned_long *)0x0);
        if (iVar2 == 0) {
          return 0;
        }
        if ((*evt | 4U) == 6) {
          iVar2 = read_script_param(this_00,buf,buflen,(osfildef *)__stream);
          return iVar2;
        }
        do {
          do {
            iVar2 = fgetc(__stream);
          } while (0xe < iVar2 + 1U);
        } while ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) == 0);
      }
      this_01 = __stream;
      iVar2 = fgetc(__stream);
      if (iVar2 < 0xd) {
        if (iVar2 == -1) {
          bVar1 = false;
          unaff_EBP = 0;
        }
        else {
          if (iVar2 != 10) {
LAB_00246a4b:
            do {
              do {
                iVar2 = fgetc(__stream);
              } while (0xe < iVar2 + 1U);
            } while ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) == 0);
          }
LAB_00246a60:
          bVar1 = true;
        }
      }
      else {
        if (iVar2 == 0xd) goto LAB_00246a60;
        if (iVar2 != 0x3e) goto LAB_00246a4b;
        *evt = 6;
        unaff_EBP = read_script_param((CVmConsole *)this_01,buf,buflen,(osfildef *)__stream);
        bVar1 = false;
      }
    } while (bVar1);
  }
  return unaff_EBP;
}

Assistant:

int CVmConsole::read_line_from_script(char *buf, size_t buflen, int *evt)
{
    /* if there's no script file, return failure */
    if (script_sp_ == 0)
        return FALSE;

    /* get the file from the script stack */
    osfildef *fp = script_sp_->fp;

    /* keep going until we find a line that we like */
    for (;;)
    {
        /* read the script according to its type ('event' or 'line input') */
        if (script_sp_->event_script)
        {
            /* read to the next event */
            if (!read_script_event_type(evt, 0))
                return FALSE;

            /* check the event code */
            switch (*evt)
            {
            case OS_EVT_LINE:
            case OS_EVT_TIMEOUT:
                /* 
                 *   it's one of our line input events - read the line (or
                 *   partial line, in the case of TIMEOUT) 
                 */
                return read_script_param(buf, buflen, fp);

            default:
                /* 
                 *   it's not our type of event - skip the rest of the line
                 *   and keep looking 
                 */
                skip_script_line(fp);
                break;
            }
        }
        else
        {
            /* 
             *   We have a basic line-input script rather than an event
             *   script.  Each input line starts with a '>'; everything else
             *   is a comment.
             *   
             *   Read the first character on the line.  If it's not a
             *   newline, there's more text on the same line, so read the
             *   rest and determine what to do.  
             */
            int c = osfgetc(fp);
            if (c == '>')
            {
                /* it's a command line - read it */
                *evt = OS_EVT_LINE;
                return read_script_param(buf, buflen, fp);
            }
            else if (c == EOF)
            {
                /* end of file */
                return FALSE;
            }
            else if (c == '\n' || c == '\r')
            {
                /* blank line - continue on to the next line */
            }
            else
            {
                /* it's not a command line - just skip it and keep looking */
                skip_script_line(fp);
            }
        }
    }
}